

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OBitwiseAnd
          (_Type_CLASS_OBJECT *this,Variable *object_1,Variable *object_2)

{
  bool bVar1;
  Object *pOVar2;
  ClassObject *pCVar3;
  Type *this_00;
  State *state;
  uint *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Variable local_a8;
  Variable local_98;
  undefined1 local_88 [8];
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Callback *call;
  undefined1 local_38 [8];
  Variable v;
  Variable *object_2_local;
  Variable *object_1_local;
  _Type_CLASS_OBJECT *this_local;
  
  v.nb_ref = in_RCX;
  pOVar2 = Variable::operator->(object_2);
  pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
  Class::GetOperator((Class *)local_38,(OperatorType)pCVar3->ClassBase);
  pOVar2 = Variable::operator->((Variable *)local_38);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->(object_2);
    pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
    if (pCVar3->ScriptState == (State *)0x0) {
      pOVar2 = Variable::operator->(object_2);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    }
    else {
      pOVar2 = Variable::operator->((Variable *)local_38);
      state = (State *)Object::GetData<LiteScript::Callback>(pOVar2);
      Nullable<LiteScript::Variable>::Nullable
                ((Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,object_2);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      Nullable<LiteScript::Variable>::~Nullable
                ((Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88);
      Variable::Variable(&local_98,(Variable *)v.nb_ref);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88,
                 &local_98);
      Variable::~Variable(&local_98);
      Variable::Variable(&local_a8,object_2);
      pOVar2 = Variable::operator->(&local_a8);
      pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
      Callback::operator()
                ((Callback *)this,state,
                 (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                 pCVar3->ScriptState);
      Variable::~Variable(&local_a8);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88);
    }
  }
  else {
    pOVar2 = Variable::operator->(object_2);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  }
  Variable::~Variable((Variable *)local_38);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OBitwiseAnd(const Variable& object_1, const Variable& object_2) const {
    Variable v = object_1->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_BIT_AND);
    if (v->GetType() == Type::CALLBACK) {
        if (object_1->GetData<ClassObject>().ScriptState == nullptr)
            return object_1->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object_1);
        std::vector<Variable> args;
        args.push_back(Variable(object_2));
        return call(*(Variable(object_1)->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object_1->memory.Create(Type::NIL);
    }
}